

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ecdsa_signature_parse_compact
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *input64)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  int overflow;
  secp256k1_scalar s;
  secp256k1_scalar r;
  
  overflow = 0;
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/secp256k1.c"
            ,0x186,"test condition failed: ctx != NULL");
    abort();
  }
  if (sig == (secp256k1_ecdsa_signature *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "sig != NULL";
  }
  else {
    if (input64 != (uchar *)0x0) {
      secp256k1_scalar_set_b32(&r,input64,&overflow);
      iVar1 = overflow;
      secp256k1_scalar_set_b32(&s,input64 + 0x20,&overflow);
      if (iVar1 != 0 || overflow != 0) {
        sig->data[0x30] = '\0';
        sig->data[0x31] = '\0';
        sig->data[0x32] = '\0';
        sig->data[0x33] = '\0';
        sig->data[0x34] = '\0';
        sig->data[0x35] = '\0';
        sig->data[0x36] = '\0';
        sig->data[0x37] = '\0';
        sig->data[0x38] = '\0';
        sig->data[0x39] = '\0';
        sig->data[0x3a] = '\0';
        sig->data[0x3b] = '\0';
        sig->data[0x3c] = '\0';
        sig->data[0x3d] = '\0';
        sig->data[0x3e] = '\0';
        sig->data[0x3f] = '\0';
        sig->data[0x20] = '\0';
        sig->data[0x21] = '\0';
        sig->data[0x22] = '\0';
        sig->data[0x23] = '\0';
        sig->data[0x24] = '\0';
        sig->data[0x25] = '\0';
        sig->data[0x26] = '\0';
        sig->data[0x27] = '\0';
        sig->data[0x28] = '\0';
        sig->data[0x29] = '\0';
        sig->data[0x2a] = '\0';
        sig->data[0x2b] = '\0';
        sig->data[0x2c] = '\0';
        sig->data[0x2d] = '\0';
        sig->data[0x2e] = '\0';
        sig->data[0x2f] = '\0';
        sig->data[0x10] = '\0';
        sig->data[0x11] = '\0';
        sig->data[0x12] = '\0';
        sig->data[0x13] = '\0';
        sig->data[0x14] = '\0';
        sig->data[0x15] = '\0';
        sig->data[0x16] = '\0';
        sig->data[0x17] = '\0';
        sig->data[0x18] = '\0';
        sig->data[0x19] = '\0';
        sig->data[0x1a] = '\0';
        sig->data[0x1b] = '\0';
        sig->data[0x1c] = '\0';
        sig->data[0x1d] = '\0';
        sig->data[0x1e] = '\0';
        sig->data[0x1f] = '\0';
        sig->data[0] = '\0';
        sig->data[1] = '\0';
        sig->data[2] = '\0';
        sig->data[3] = '\0';
        sig->data[4] = '\0';
        sig->data[5] = '\0';
        sig->data[6] = '\0';
        sig->data[7] = '\0';
        sig->data[8] = '\0';
        sig->data[9] = '\0';
        sig->data[10] = '\0';
        sig->data[0xb] = '\0';
        sig->data[0xc] = '\0';
        sig->data[0xd] = '\0';
        sig->data[0xe] = '\0';
        sig->data[0xf] = '\0';
        return 0;
      }
      secp256k1_ecdsa_signature_save(sig,&r,&s);
      return 1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "input64 != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ecdsa_signature_parse_compact(const secp256k1_context* ctx, secp256k1_ecdsa_signature* sig, const unsigned char *input64) {
    secp256k1_scalar r, s;
    int ret = 1;
    int overflow = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(input64 != NULL);

    secp256k1_scalar_set_b32(&r, &input64[0], &overflow);
    ret &= !overflow;
    secp256k1_scalar_set_b32(&s, &input64[32], &overflow);
    ret &= !overflow;
    if (ret) {
        secp256k1_ecdsa_signature_save(sig, &r, &s);
    } else {
        memset(sig, 0, sizeof(*sig));
    }
    return ret;
}